

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O3

ostream * ninx::lexer::token::operator<<(ostream *strm,Token *a)

{
  ostream *poVar1;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  (*a->_vptr_Token[3])(&local_30);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(strm,(char *)local_30,local_28);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream &strm, const Token &a) {
                    return strm << a.dump();
                }